

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O3

void r_code::Atom::Trace(Atom *base,uint16_t count)

{
  ostream *poVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--------\n",9);
  if ((int)CONCAT62(in_register_00000032,count) != 0) {
    uVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      trace(base);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
      uVar2 = uVar2 + 1;
      base = base + 1;
    } while (count != uVar2);
  }
  return;
}

Assistant:

void Atom::Trace(Atom *base, uint16_t count)
{
    std::cout << "--------\n";

    for (uint16_t i = 0; i < count; ++i) {
        std::cout << i << "\t";
        base[i].trace();
        std::cout << std::endl;
    }
}